

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::GetWindowAlwaysWantOwnTabBar(ImGuiWindow *window)

{
  bool bVar1;
  
  if (((((GImGui->IO).ConfigDockingAlwaysTabBar == false) &&
       ((window->WindowClass).DockingAlwaysTabBar != true)) || ((window->Flags & 0x1200001U) != 0))
     || (bVar1 = true, window->IsFallbackWindow == true)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::GetWindowAlwaysWantOwnTabBar(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.IO.ConfigDockingAlwaysTabBar || window->WindowClass.DockingAlwaysTabBar)
        if ((window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoDocking)) == 0)
            if (!window->IsFallbackWindow)    // We don't support AlwaysTabBar on the fallback/implicit window to avoid unused dock-node overhead/noise
                return true;
    return false;
}